

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall icu_63::TimeZoneNamesImpl::cleanup(TimeZoneNamesImpl *this,EVP_PKEY_CTX *ctx)

{
  if (this->fZoneStrings != (UResourceBundle *)0x0) {
    ures_close_63(this->fZoneStrings);
    this->fZoneStrings = (UResourceBundle *)0x0;
  }
  if (this->fMZNamesMap != (UHashtable *)0x0) {
    uhash_close_63(this->fMZNamesMap);
    this->fMZNamesMap = (UHashtable *)0x0;
  }
  if (this->fTZNamesMap != (UHashtable *)0x0) {
    uhash_close_63(this->fTZNamesMap);
    this->fTZNamesMap = (UHashtable *)0x0;
  }
  return;
}

Assistant:

void
TimeZoneNamesImpl::cleanup() {
    if (fZoneStrings != NULL) {
        ures_close(fZoneStrings);
        fZoneStrings = NULL;
    }
    if (fMZNamesMap != NULL) {
        uhash_close(fMZNamesMap);
        fMZNamesMap = NULL;
    }
    if (fTZNamesMap != NULL) {
        uhash_close(fTZNamesMap);
        fTZNamesMap = NULL;
    }
}